

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDecoder.cpp
# Opt level: O1

DecoderResult * ZXing::DataMatrix::DoDecode(DecoderResult *__return_storage_ptr__,BitMatrix *bits)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer puVar3;
  size_type sVar4;
  SymbologyIdentifier SVar5;
  char cVar6;
  undefined8 *puVar7;
  _Optional_payload_base<std::array<int,_3UL>_> _Var8;
  uint uVar9;
  bool bVar10;
  uint8_t val;
  byte val_00;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  const_iterator __begin0;
  Version *version;
  pointer pDVar17;
  GenericGF *field;
  ulong uVar18;
  long *plVar19;
  char cVar20;
  int iVar21;
  const_iterator __end0;
  Mode mode;
  int iVar22;
  long lVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  size_type __n;
  bool bVar25;
  ulong uVar26;
  bool bVar27;
  long lVar28;
  uint __len;
  ulong uVar29;
  BitSource bits_1;
  Content result;
  vector<int,_std::allocator<int>_> codewordsInts;
  Error error;
  string resultTrailer;
  StructuredAppendInfo sai;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> dataBlocks;
  ByteArray resultBytes;
  ByteArray codewords;
  optional<std::array<int,_3UL>_> triple;
  BitSource local_588;
  undefined4 local_574;
  DecoderResult *local_570;
  Content local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_528;
  size_type local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  string local_508;
  pointer pEStack_4e8;
  pointer local_4e0;
  SymbologyIdentifier local_4d8;
  CharacterSet local_4d4;
  bool bStack_4d3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4d0;
  size_type local_4c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4c0;
  undefined8 local_4b0;
  undefined1 auStack_4a8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4a0;
  size_type local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_490;
  undefined2 local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_478;
  size_type local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  undefined8 local_458;
  undefined2 uStack_450;
  undefined1 uStack_44e;
  element_type *local_448;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_438;
  ulong local_430;
  Version *local_428;
  uint local_41c;
  uint *local_418;
  long local_410;
  uint local_408;
  undefined4 uStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  uint *local_3f8;
  long local_3f0;
  uint local_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  uint *local_3d8;
  long local_3d0;
  uint local_3c8;
  undefined4 uStack_3c4;
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  uint *local_3b8;
  long local_3b0;
  uint local_3a8;
  undefined4 uStack_3a4;
  undefined4 uStack_3a0;
  undefined4 uStack_39c;
  uint *local_398;
  long local_390;
  uint local_388;
  undefined4 uStack_384;
  undefined4 uStack_380;
  undefined4 uStack_37c;
  undefined1 *local_378;
  undefined8 local_370;
  undefined1 local_368;
  undefined7 uStack_367;
  undefined7 local_358;
  undefined1 uStack_351;
  undefined2 uStack_350;
  undefined1 uStack_34e;
  undefined1 *local_348;
  undefined8 local_340;
  undefined1 local_338;
  uint7 uStack_337;
  undefined8 uStack_330;
  undefined1 *local_328;
  long local_320;
  undefined1 local_318;
  undefined7 uStack_317;
  undefined1 local_308 [8];
  undefined1 *local_300;
  undefined8 local_2f8;
  undefined1 local_2f0;
  undefined7 uStack_2ef;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  size_type local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  uint *local_2b0;
  long local_2a8;
  uint local_2a0;
  undefined4 uStack_29c;
  undefined4 uStack_298;
  undefined4 uStack_294;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  size_type local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  uint *local_270;
  long local_268;
  uint local_260;
  undefined4 uStack_25c;
  undefined4 uStack_258;
  undefined4 uStack_254;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> local_250;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_238;
  Error local_220;
  char **local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  ByteArray local_1e0;
  long *local_1c8 [2];
  long local_1b8 [2];
  _Optional_payload_base<std::array<int,_3UL>_> local_1a8;
  Error local_198;
  DecoderResult local_168;
  Error local_90;
  Error local_60;
  
  local_570 = __return_storage_ptr__;
  version = VersionForDimensions(bits->_height,bits->_width);
  if (version == (Version *)0x0) {
    local_290 = &local_280;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_290,"Invalid matrix dimension","");
    paVar24 = &local_60._msg.field_2;
    if (local_290 == &local_280) {
      local_60._msg.field_2._8_8_ = local_280._8_8_;
      local_60._msg._M_dataplus._M_p = (pointer)paVar24;
    }
    else {
      local_60._msg._M_dataplus._M_p = (pointer)local_290;
    }
    local_60._msg.field_2._M_allocated_capacity._1_7_ = local_280._M_allocated_capacity._1_7_;
    local_60._msg.field_2._M_local_buf[0] = local_280._M_local_buf[0];
    local_60._msg._M_string_length = local_288;
    local_288 = 0;
    local_280._M_local_buf[0] = '\0';
    local_60._file = "src/datamatrix/DMDecoder.cpp";
    local_60._line = 0x188;
    local_60._type = Format;
    local_290 = &local_280;
    DecoderResult::DecoderResult(local_570,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._msg._M_dataplus._M_p != paVar24) {
      operator_delete(local_60._msg._M_dataplus._M_p,local_60._msg.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_290 == &local_280) {
      return local_570;
    }
    uVar26 = CONCAT71(local_280._M_allocated_capacity._1_7_,local_280._M_local_buf[0]) + 1;
    local_1e0.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_290;
  }
  else {
    CodewordsFromBitMatrix(&local_1e0,bits,version);
    if (local_1e0.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_1e0.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_2d0 = &local_2c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2d0,"Invalid number of code words","");
      paVar24 = &local_90._msg.field_2;
      if (local_2d0 == &local_2c0) {
        local_90._msg.field_2._8_8_ = local_2c0._8_8_;
        local_90._msg._M_dataplus._M_p = (pointer)paVar24;
      }
      else {
        local_90._msg._M_dataplus._M_p = (pointer)local_2d0;
      }
      local_90._msg.field_2._M_allocated_capacity._1_7_ = local_2c0._M_allocated_capacity._1_7_;
      local_90._msg.field_2._M_local_buf[0] = local_2c0._M_local_buf[0];
      local_90._msg._M_string_length = local_2c8;
      local_2c8 = 0;
      local_2c0._M_local_buf[0] = '\0';
      local_90._file = "src/datamatrix/DMDecoder.cpp";
      local_90._line = 0x18d;
      local_90._type = Format;
      local_2d0 = &local_2c0;
      DecoderResult::DecoderResult(local_570,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._msg._M_dataplus._M_p != paVar24) {
        operator_delete(local_90._msg._M_dataplus._M_p,
                        local_90._msg.field_2._M_allocated_capacity + 1);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,
                        CONCAT71(local_2c0._M_allocated_capacity._1_7_,local_2c0._M_local_buf[0]) +
                        1);
      }
    }
    else {
      local_438 = &local_468;
      local_2e0 = &local_458;
      local_1e8 = &local_168._error._msg.field_2;
      local_1f0 = &local_168._error._file;
      local_430 = 0;
      local_428 = version;
      do {
        paVar24 = &local_220._msg.field_2;
        GetDataBlocks(&local_250,&local_1e0,version,(bool)((byte)local_430 & 1));
        if (local_250.
            super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_250.
            super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_528 = &local_518;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_528,"Invalid number of data blocks","");
          if (local_528 == &local_518) {
            local_220._msg.field_2._8_8_ = local_518._8_8_;
            local_220._msg._M_dataplus._M_p = (pointer)paVar24;
          }
          else {
            local_220._msg._M_dataplus._M_p = (pointer)local_528;
          }
          local_220._msg.field_2._M_allocated_capacity._1_7_ = local_518._M_allocated_capacity._1_7_
          ;
          local_220._msg.field_2._M_local_buf[0] = local_518._M_local_buf[0];
          local_220._msg._M_string_length = local_520;
          local_520 = 0;
          local_518._M_local_buf[0] = '\0';
          local_220._file = "src/datamatrix/DMDecoder.cpp";
          local_220._line = 0x194;
          local_220._type = Format;
          local_528 = &local_518;
          DecoderResult::DecoderResult(local_570,&local_220);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._msg._M_dataplus._M_p != paVar24) {
            operator_delete(local_220._msg._M_dataplus._M_p,
                            local_220._msg.field_2._M_allocated_capacity + 1);
          }
          if (local_528 != &local_518) {
            operator_delete(local_528,
                            CONCAT71(local_518._M_allocated_capacity._1_7_,local_518._M_local_buf[0]
                                    ) + 1);
          }
          bVar10 = false;
        }
        else {
          __n = 0;
          pDVar17 = local_250.
                    super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            __n = (long)(int)__n + (long)pDVar17->numDataCodewords;
            pDVar17 = pDVar17 + 1;
          } while (pDVar17 !=
                   local_250.
                   super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
          local_508._M_dataplus._M_p = local_508._M_dataplus._M_p & 0xffffffffffffff00;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&local_238,__n,(value_type_conflict *)&local_508,(allocator_type *)&local_168);
          iVar11 = 3;
          uVar15 = (uint)((ulong)((long)local_250.
                                        super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_250.
                                       super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 5);
          if (0 < (int)uVar15) {
            uVar29 = (ulong)(uVar15 & 0x7fffffff);
            uVar26 = 0;
            do {
              pDVar17 = local_250.
                        super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar15 = local_250.
                       super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar26].numDataCodewords;
              std::vector<int,std::allocator<int>>::
              vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                        ((vector<int,std::allocator<int>> *)&local_508,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )local_250.
                           super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar26].codewords.
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                         (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )local_250.
                           super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar26].codewords.
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish,(allocator_type *)&local_168);
              pDVar17 = pDVar17 + uVar26;
              puVar2 = (pDVar17->codewords).
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar3 = (pDVar17->codewords).
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              field = GenericGF::DataMatrixField256();
              bVar10 = ReedSolomonDecode(field,(vector<int,_std::allocator<int>_> *)&local_508,
                                         ((int)puVar3 - (int)puVar2) - uVar15);
              if (0 < (int)uVar15 && bVar10) {
                puVar2 = (pDVar17->codewords).
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                lVar28 = (ulong)uVar15 + 1;
                lVar23 = 0;
                do {
                  puVar2[lVar23] = local_508._M_dataplus._M_p[lVar23 * 4];
                  lVar28 = lVar28 + -1;
                  lVar23 = lVar23 + 1;
                } while (1 < lVar28);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_508._M_dataplus._M_p !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_508._M_dataplus._M_p,
                                local_508.field_2._M_allocated_capacity -
                                (long)local_508._M_dataplus._M_p);
              }
              if (bVar10) {
                iVar11 = 0;
                if (0 < pDVar17->numDataCodewords) {
                  lVar23 = 0;
                  uVar18 = uVar26;
                  do {
                    local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[uVar18] =
                         (pDVar17->codewords).
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar23];
                    lVar23 = lVar23 + 1;
                    uVar18 = uVar18 + uVar29;
                    iVar11 = 0;
                  } while (lVar23 < pDVar17->numDataCodewords);
                }
              }
              else {
                paVar24 = &local_198._msg.field_2;
                if ((local_428->versionNumber == 0x18) && ((local_430 & 1) == 0)) {
                  local_430 = CONCAT71((int7)((ulong)local_428 >> 8),1);
                  iVar11 = 2;
                }
                else {
                  local_348 = &local_338;
                  local_198._msg.field_2._M_allocated_capacity = (ulong)uStack_337 << 8;
                  local_198._msg.field_2._8_8_ = uStack_330;
                  local_198._msg._M_string_length = 0;
                  local_340 = 0;
                  local_338 = 0;
                  local_198._file = "src/datamatrix/DMDecoder.cpp";
                  local_198._line = 0x1a2;
                  local_198._type = Checksum;
                  local_198._msg._M_dataplus._M_p = (pointer)paVar24;
                  DecoderResult::DecoderResult(local_570,&local_198);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_198._msg._M_dataplus._M_p != paVar24) {
                    operator_delete(local_198._msg._M_dataplus._M_p,
                                    local_198._msg.field_2._M_allocated_capacity + 1);
                  }
                  iVar11 = 1;
                  if (local_348 != &local_338) {
                    operator_delete(local_348,CONCAT71(uStack_337,local_338) + 1);
                  }
                }
              }
              if (!bVar10) goto LAB_0014f0cc;
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar29);
            iVar11 = 3;
          }
LAB_0014f0cc:
          version = local_428;
          if (iVar11 == 3) {
            iVar11 = local_428->versionNumber;
            local_588._bytes = (ByteArray *)&local_238;
            local_588._byteOffset = 0;
            local_588._bitOffset = 0;
            Content::Content(&local_568);
            local_41c = iVar11 - 0x1f;
            local_370 = 0;
            local_368 = 0;
            local_358 = 0;
            uStack_351 = 0;
            uStack_350 = 0xffff;
            uStack_34e = 0;
            local_568.symbology.code = 'd';
            local_568.symbology.modifier = '1';
            local_568.symbology.eciModifierOffset = '\x03';
            local_568.symbology.aiFlag = None;
            local_328 = &local_318;
            local_320 = 0;
            local_318 = 0;
            local_308._0_4_ = -1;
            local_308._4_4_ = -1;
            local_300 = &local_2f0;
            local_2f8 = 0;
            bVar27 = false;
            local_2f0 = 0;
            local_2d8 = 1;
            bVar10 = true;
            bVar25 = false;
            local_574 = 0;
            local_378 = &local_368;
            do {
              iVar11 = BitSource::available(&local_588);
              if (iVar11 < 8) break;
              iVar11 = BitSource::readBits(&local_588,8);
              uVar15 = iVar11 - 0xe6;
              if (0xb < uVar15) {
                if (iVar11 == 0x81) {
                  bVar27 = true;
                }
                else {
                  if (iVar11 == 0) {
                    plVar19 = (long *)__cxa_allocate_exception(0x30);
                    local_3b8 = &local_3a8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3b8,"invalid 0 code word","");
                    *plVar19 = (long)(plVar19 + 2);
                    if (local_3b8 == &local_3a8) {
                      *(uint *)(plVar19 + 2) = local_3a8;
                      *(undefined4 *)((long)plVar19 + 0x14) = uStack_3a4;
                      *(undefined4 *)(plVar19 + 3) = uStack_3a0;
                      *(undefined4 *)((long)plVar19 + 0x1c) = uStack_39c;
                    }
                    else {
                      *plVar19 = (long)local_3b8;
                      plVar19[2] = CONCAT44(uStack_3a4,local_3a8);
                    }
                    plVar19[1] = local_3b0;
                    local_3b8 = &local_3a8;
                    local_3b0 = 0;
                    local_3a8 = local_3a8 & 0xffffff00;
                    plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
                    *(undefined2 *)(plVar19 + 5) = 0x125;
                    *(undefined1 *)((long)plVar19 + 0x2a) = 1;
                    __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
                  }
                  if (iVar11 < 0x81) {
                    Content::push_back(&local_568,(char)iVar11 + (char)local_574 * -0x80 + 0xff);
                    local_574 = 0;
                  }
                  else if (iVar11 < 0xe6) {
                    ToString<int,void>(&local_508,(ZXing *)(ulong)(iVar11 - 0x82),2,uVar15);
                    std::vector<unsigned_char,std::allocator<unsigned_char>>::
                    _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_568,
                               local_568.bytes.
                               super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish,local_508._M_dataplus._M_p,
                               local_508._M_dataplus._M_p + local_508._M_string_length);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_508._M_dataplus._M_p != &local_508.field_2) {
                      operator_delete(local_508._M_dataplus._M_p,
                                      local_508.field_2._M_allocated_capacity + 1);
                    }
                  }
                  else if ((0xf1 < iVar11) &&
                          ((iVar11 != 0xfe ||
                           (iVar11 = BitSource::available(&local_588), iVar11 != 0)))) {
                    plVar19 = (long *)__cxa_allocate_exception(0x30);
                    local_418 = &local_408;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_418,"invalid code word","");
                    *plVar19 = (long)(plVar19 + 2);
                    if (local_418 == &local_408) {
                      *(uint *)(plVar19 + 2) = local_408;
                      *(undefined4 *)((long)plVar19 + 0x14) = uStack_404;
                      *(undefined4 *)(plVar19 + 3) = uStack_400;
                      *(undefined4 *)((long)plVar19 + 0x1c) = uStack_3fc;
                    }
                    else {
                      *plVar19 = (long)local_418;
                      plVar19[2] = CONCAT44(uStack_404,local_408);
                    }
                    plVar19[1] = local_410;
                    local_418 = &local_408;
                    local_410 = 0;
                    local_408 = local_408 & 0xffffff00;
                    plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
                    *(undefined2 *)(plVar19 + 5) = 0x155;
                    *(undefined1 *)((long)plVar19 + 0x2a) = 1;
                    __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
                  }
                }
                goto LAB_0014f87a;
              }
              iVar11 = local_588._byteOffset;
              switch(uVar15) {
              case 0:
                mode = C40;
                goto LAB_0014f311;
              case 1:
                iVar16 = BitSource::readBits(&local_588,8);
                iVar12 = iVar11 + 2;
                iVar21 = iVar11 * 0x95;
                iVar22 = (int)((ulong)((long)(iVar21 + 0x95) * -0x7f7f7f7f) >> 0x20) + iVar21 + 0x95
                ;
                uVar15 = iVar16 + ~(iVar21 + ((iVar22 >> 7) - (iVar22 >> 0x1f)) * -0xff + 0x95U);
                uVar15 = (uVar15 >> 0x17 & 0x100) + uVar15;
                if (uVar15 == 0) {
                  iVar16 = BitSource::available(&local_588);
                  iVar11 = iVar16 + 7;
                  if (-1 < iVar16) {
                    iVar11 = iVar16;
                  }
                  uVar15 = iVar11 >> 3;
                }
                else if (0xf9 < (int)uVar15) {
                  iVar16 = BitSource::readBits(&local_588,8);
                  uVar14 = iVar16 + ~((iVar12 * 0x95) % 0xff);
                  uVar15 = ((uVar14 >> 0x17 & 0x100) + uVar15 * 0xfa + uVar14) - 0xf32a;
                  iVar12 = iVar11 + 3;
                }
                if ((int)uVar15 < 0) {
                  plVar19 = (long *)__cxa_allocate_exception(0x30);
                  local_398 = &local_388;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_398,"invalid count in Base256 segment","");
                  *plVar19 = (long)(plVar19 + 2);
                  if (local_398 == &local_388) {
                    *(uint *)(plVar19 + 2) = local_388;
                    *(undefined4 *)((long)plVar19 + 0x14) = uStack_384;
                    *(undefined4 *)(plVar19 + 3) = uStack_380;
                    *(undefined4 *)((long)plVar19 + 0x1c) = uStack_37c;
                  }
                  else {
                    *plVar19 = (long)local_398;
                    plVar19[2] = CONCAT44(uStack_384,local_388);
                  }
                  plVar19[1] = local_390;
                  local_398 = &local_388;
                  local_390 = 0;
                  local_388 = local_388 & 0xffffff00;
                  plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
                  *(undefined2 *)(plVar19 + 5) = 0x106;
                  *(undefined1 *)((long)plVar19 + 0x2a) = 1;
                  __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
                }
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_568,
                           (size_type)
                           (local_568.bytes.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish +
                           ((ulong)uVar15 -
                           (long)local_568.bytes.
                                 super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start)));
                if (uVar15 != 0) {
                  iVar12 = iVar12 * 0x95;
                  do {
                    iVar11 = BitSource::readBits(&local_588,8);
                    Content::push_back(&local_568,
                                       (char)iVar11 + ~((char)(iVar12 / 0xff) + (char)iVar12));
                    iVar12 = iVar12 + 0x95;
                    uVar15 = uVar15 - 1;
                  } while (uVar15 != 0);
                }
                break;
              case 2:
                if (local_588._byteOffset == (int)local_2d8) {
                  local_568.symbology.modifier = '2';
                }
                else if (local_588._byteOffset == (int)local_2d8 + 1) {
                  local_568.symbology.modifier = '3';
                }
                else {
                  Content::push_back(&local_568,'\x1d');
                }
                break;
              case 3:
                if (!bVar10) {
                  plVar19 = (long *)__cxa_allocate_exception(0x30);
                  local_3d8 = &local_3c8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_3d8,"structured append tag must be first code word",""
                            );
                  *plVar19 = (long)(plVar19 + 2);
                  if (local_3d8 == &local_3c8) {
                    *(uint *)(plVar19 + 2) = local_3c8;
                    *(undefined4 *)((long)plVar19 + 0x14) = uStack_3c4;
                    *(undefined4 *)(plVar19 + 3) = uStack_3c0;
                    *(undefined4 *)((long)plVar19 + 0x1c) = uStack_3bc;
                  }
                  else {
                    *plVar19 = (long)local_3d8;
                    plVar19[2] = CONCAT44(uStack_3c4,local_3c8);
                  }
                  plVar19[1] = local_3d0;
                  local_3d8 = &local_3c8;
                  local_3d0 = 0;
                  local_3c8 = local_3c8 & 0xffffff00;
                  plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
                  *(undefined2 *)(plVar19 + 5) = 0x136;
                  *(undefined1 *)((long)plVar19 + 0x2a) = 1;
                  __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
                }
                uVar15 = BitSource::readBits(&local_588,8);
                local_308._4_4_ = 0x11 - (uVar15 & 0xf);
                if ((int)local_308._4_4_ <= (int)uVar15 >> 4) {
                  local_308._4_4_ = 0;
                }
                if ((uVar15 & 0xf) == 0) {
                  local_308._4_4_ = 0;
                }
                local_308._0_4_ = (int)uVar15 >> 4;
                iVar11 = BitSource::readBits(&local_588,8);
                uVar14 = BitSource::readBits(&local_588,8);
                uVar14 = uVar14 | iVar11 << 8;
                uVar15 = -uVar14;
                if (0 < (int)uVar14) {
                  uVar15 = uVar14;
                }
                __len = 1;
                if (9 < uVar15) {
                  uVar26 = (ulong)uVar15;
                  uVar9 = 4;
                  do {
                    __len = uVar9;
                    uVar13 = (uint)uVar26;
                    if (uVar13 < 100) {
                      __len = __len - 2;
                      goto LAB_0014f7f3;
                    }
                    if (uVar13 < 1000) {
                      __len = __len - 1;
                      goto LAB_0014f7f3;
                    }
                    if (uVar13 < 10000) goto LAB_0014f7f3;
                    uVar26 = uVar26 / 10000;
                    uVar9 = __len + 4;
                  } while (99999 < uVar13);
                  __len = __len + 1;
                }
LAB_0014f7f3:
                local_1c8[0] = local_1b8;
                std::__cxx11::string::_M_construct
                          ((ulong)local_1c8,(char)__len - (char)((int)uVar14 >> 0x1f));
                std::__detail::__to_chars_10_impl<unsigned_int>
                          ((char *)((ulong)(uVar14 >> 0x1f) + (long)local_1c8[0]),__len,uVar15);
                std::__cxx11::string::operator=((string *)&local_300,(string *)local_1c8);
                if (local_1c8[0] != local_1b8) {
                  operator_delete(local_1c8[0],local_1b8[0] + 1);
                }
                local_2d8 = 5;
                break;
              case 4:
                bVar25 = true;
                if (!bVar10) {
                  plVar19 = (long *)__cxa_allocate_exception(0x30);
                  local_3f8 = &local_3e8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_3f8,"reader programming tag must be first code word",
                             "");
                  *plVar19 = (long)(plVar19 + 2);
                  if (local_3f8 == &local_3e8) {
                    *(uint *)(plVar19 + 2) = local_3e8;
                    *(undefined4 *)((long)plVar19 + 0x14) = uStack_3e4;
                    *(undefined4 *)(plVar19 + 3) = uStack_3e0;
                    *(undefined4 *)((long)plVar19 + 0x1c) = uStack_3dc;
                  }
                  else {
                    *plVar19 = (long)local_3f8;
                    plVar19[2] = CONCAT44(uStack_3e4,local_3e8);
                  }
                  plVar19[1] = local_3f0;
                  local_3f8 = &local_3e8;
                  local_3f0 = 0;
                  local_3e8 = local_3e8 & 0xffffff00;
                  plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
                  *(undefined2 *)(plVar19 + 5) = 0x13c;
                  *(undefined1 *)((long)plVar19 + 0x2a) = 1;
                  __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
                }
                break;
              case 5:
                local_574 = (undefined4)
                            CONCAT71((int7)((ulong)((long)&switchD_0014f1e5::switchdataD_001956d0 +
                                                   (long)(int)(&switchD_0014f1e5::
                                                                switchdataD_001956d0)[uVar15]) >> 8)
                                     ,1);
                break;
              case 6:
                local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
                local_508.field_2._M_allocated_capacity = 0x1d35301e3e295b;
                local_508._M_string_length = 7;
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_568,
                           local_568.bytes.
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish,local_508._M_dataplus._M_p,
                           (undefined1 *)((long)&local_508.field_2 + 7));
                goto LAB_0014f589;
              case 7:
                local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
                local_508.field_2._M_allocated_capacity = 0x1d36301e3e295b;
                local_508._M_string_length = 7;
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_568,
                           local_568.bytes.
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish,local_508._M_dataplus._M_p,
                           (undefined1 *)((long)&local_508.field_2 + 7));
LAB_0014f589:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_508._M_dataplus._M_p != &local_508.field_2) {
                  operator_delete(local_508._M_dataplus._M_p,
                                  local_508.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::string::replace((ulong)&local_328,0,(char *)0x0,0x195859);
                break;
              case 8:
                while( true ) {
                  local_1a8 = (_Optional_payload_base<std::array<int,_3UL>_>)
                              DecodedBitStreamParser::DecodeNextTriple(&local_588);
                  _Var8 = local_1a8;
                  bVar10 = local_1a8._M_engaged != true;
                  local_1a8 = _Var8;
                  if (bVar10) break;
                  lVar23 = 0;
                  do {
                    iVar11 = *(int *)((long)&local_1a8._M_payload + lVar23);
                    if ((long)iVar11 < 0) {
                      plVar19 = (long *)__cxa_allocate_exception(0x30);
                      local_270 = &local_260;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_270,"invalid value in AnsiX12 segment","");
                      *plVar19 = (long)(plVar19 + 2);
                      if (local_270 == &local_260) {
                        *(uint *)(plVar19 + 2) = local_260;
                        *(undefined4 *)((long)plVar19 + 0x14) = uStack_25c;
                        *(undefined4 *)(plVar19 + 3) = uStack_258;
                        *(undefined4 *)((long)plVar19 + 0x1c) = uStack_254;
                      }
                      else {
                        *plVar19 = (long)local_270;
                        plVar19[2] = CONCAT44(uStack_25c,local_260);
                      }
                      plVar19[1] = local_268;
                      local_268 = 0;
                      local_260 = local_260 & 0xffffff00;
                      plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
                      *(undefined2 *)(plVar19 + 5) = 0xc4;
                      *(undefined1 *)((long)plVar19 + 0x2a) = 1;
                      local_270 = &local_260;
                      __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
                    }
                    if (iVar11 < 4) {
                      val = *(uint8_t *)
                             ((long)&DecodedBitStreamParser::
                                     DecodeAnsiX12Segment(ZXing::BitSource&,ZXing::Content&)::
                                     segChars + (long)iVar11);
                    }
                    else if (iVar11 < 0xe) {
                      val = (char)iVar11 + ',';
                    }
                    else {
                      if (0x27 < iVar11) {
                        plVar19 = (long *)__cxa_allocate_exception(0x30);
                        local_2b0 = &local_2a0;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_2b0,"invalid value in AnsiX12 segment","");
                        *plVar19 = (long)(plVar19 + 2);
                        if (local_2b0 == &local_2a0) {
                          *(uint *)(plVar19 + 2) = local_2a0;
                          *(undefined4 *)((long)plVar19 + 0x14) = uStack_29c;
                          *(undefined4 *)(plVar19 + 3) = uStack_298;
                          *(undefined4 *)((long)plVar19 + 0x1c) = uStack_294;
                        }
                        else {
                          *plVar19 = (long)local_2b0;
                          plVar19[2] = CONCAT44(uStack_29c,local_2a0);
                        }
                        plVar19[1] = local_2a8;
                        local_2a8 = 0;
                        local_2a0 = local_2a0 & 0xffffff00;
                        plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
                        *(undefined2 *)(plVar19 + 5) = 0xcc;
                        *(undefined1 *)((long)plVar19 + 0x2a) = 1;
                        local_2b0 = &local_2a0;
                        __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
                      }
                      val = (char)iVar11 + '3';
                    }
                    Content::push_back(&local_568,val);
                    lVar23 = lVar23 + 4;
                  } while (lVar23 != 0xc);
                }
                break;
              case 9:
                mode = TEXT;
LAB_0014f311:
                DecodedBitStreamParser::DecodeC40OrTextSegment(&local_588,&local_568,mode);
                break;
              case 10:
                iVar11 = BitSource::available(&local_588);
                if (0x17 < iVar11) {
                  bVar10 = false;
                  uVar15 = 0;
LAB_0014f5df:
                  do {
                    uVar14 = BitSource::readBits(&local_588,6);
                    if ((uVar14 & 0xff) == 0x1f) {
                      if (local_588._bitOffset != 0) {
                        BitSource::readBits(&local_588,8 - local_588._bitOffset);
                      }
                    }
                    else {
                      val_00 = (byte)uVar14;
                      if ((uVar14 & 0x20) == 0) {
                        val_00 = (byte)uVar14 | 0x40;
                      }
                      Content::push_back(&local_568,val_00);
                    }
                    if ((uVar14 & 0xff) == 0x1f) {
                      if (!bVar10) break;
                    }
                    else {
                      bVar10 = 2 < uVar15;
                      uVar15 = uVar15 + 1;
                      if (uVar15 != 4) goto LAB_0014f5df;
                    }
                    iVar11 = BitSource::available(&local_588);
                    bVar10 = false;
                    uVar15 = 0;
                  } while (0x17 < iVar11);
                }
                break;
              case 0xb:
                iVar11 = BitSource::readBits(&local_588,8);
                if (0x7f < iVar11) {
                  iVar12 = BitSource::readBits(&local_588,8);
                  if (iVar11 < 0xc0) {
                    iVar11 = iVar11 * 0xfe + iVar12 + -0x7e81;
                  }
                  else {
                    iVar16 = BitSource::readBits(&local_588,8);
                    iVar11 = iVar16 + iVar12 * 0xfe + iVar11 * 0xfc04 + -0xbcc3ff;
                  }
                }
                Content::switchEncoding(&local_568,iVar11 + Unknown,true);
              }
LAB_0014f87a:
              bVar10 = false;
            } while (!bVar27);
            std::vector<unsigned_char,std::allocator<unsigned_char>>::
            _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_568,
                       local_568.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish,local_328,local_328 + local_320);
            SVar5 = local_568.symbology;
            cVar6 = local_568.symbology.modifier;
            bVar10 = local_568.symbology.modifier == '2';
            local_568.symbology.aiFlag = bVar10;
            cVar20 = '\0';
            if (local_41c < 0x12) {
              cVar20 = '\x06';
            }
            local_568.symbology.code = SVar5.code;
            local_568.symbology.modifier = cVar20 + cVar6;
            local_508._M_dataplus._M_p =
                 (pointer)local_568.bytes.
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
            local_508._M_string_length =
                 (size_type)
                 local_568.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_508.field_2._M_allocated_capacity =
                 (size_type)
                 local_568.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_568.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_568.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_568.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_508.field_2._8_8_ =
                 local_568.encodings.
                 super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            pEStack_4e8 = local_568.encodings.
                          super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
            local_4e0 = local_568.encodings.
                        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_568.encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_568.encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_568.encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_4d4 = local_568.defaultCharset;
            bStack_4d3 = local_568.hasECI;
            local_4d8 = local_568.symbology;
            local_4c8 = 0;
            local_4c0._M_local_buf[0] = '\0';
            local_4b0._0_4_ = 0;
            local_4b0._4_4_ = 0;
            auStack_4a8 = (undefined1  [8])0xffffffffffffffff;
            local_4a0 = &local_490;
            local_498 = 0;
            local_490._M_local_buf[0] = '\0';
            local_480 = 0;
            local_478 = local_438;
            local_470 = 0;
            local_468._M_local_buf[0] = '\0';
            local_458 = 0;
            uStack_450 = 0xffff;
            uStack_44e = 0;
            local_448 = (element_type *)0x0;
            p_Stack_440 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_4d0 = &local_4c0;
            std::__cxx11::string::operator=((string *)&local_478,(string *)&local_378);
            puVar7 = local_2e0;
            *(uint *)((long)local_2e0 + 7) = CONCAT13(uStack_34e,CONCAT21(uStack_350,uStack_351));
            *puVar7 = CONCAT17(uStack_351,local_358);
            auStack_4a8 = local_308;
            std::__cxx11::string::_M_assign((string *)&local_4a0);
            paVar24 = local_1e8;
            version = local_428;
            local_480._1_1_ = bVar25;
            local_168._ecLevel._M_dataplus._M_p = (pointer)&local_168._ecLevel.field_2;
            if (local_4d0 == &local_4c0) {
              local_168._ecLevel.field_2._8_8_ = local_4c0._8_8_;
            }
            else {
              local_168._ecLevel._M_dataplus._M_p = (pointer)local_4d0;
            }
            local_168._ecLevel.field_2._M_allocated_capacity._1_7_ =
                 local_4c0._M_allocated_capacity._1_7_;
            local_168._ecLevel.field_2._M_local_buf[0] = local_4c0._M_local_buf[0];
            paVar1 = &local_168._structuredAppend.id.field_2;
            if (local_4a0 == &local_490) {
              local_168._structuredAppend.id.field_2._8_8_ = local_490._8_8_;
              local_168._structuredAppend.id._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_168._structuredAppend.id._M_dataplus._M_p = (pointer)local_4a0;
            }
            local_168._structuredAppend.id.field_2._M_allocated_capacity._1_7_ =
                 local_490._M_allocated_capacity._1_7_;
            local_168._structuredAppend.id.field_2._M_local_buf[0] = local_490._M_local_buf[0];
            local_168._error._msg._M_dataplus._M_p = (pointer)local_1e8;
            if (local_478 == local_438) {
              sVar4 = *(size_type *)(local_438->_M_local_buf + 8);
              local_1e8->_M_allocated_capacity = local_438->_M_allocated_capacity;
              *(size_type *)(local_1e8->_M_local_buf + 8) = sVar4;
            }
            else {
              local_168._error._msg._M_dataplus._M_p = (pointer)local_478;
              local_168._error._msg.field_2._M_allocated_capacity =
                   CONCAT71(local_468._M_allocated_capacity._1_7_,local_468._M_local_buf[0]);
            }
            *(undefined4 *)((long)local_1f0 + 7) = *(undefined4 *)((long)local_2e0 + 7);
            *local_1f0 = (char *)*local_2e0;
            local_168._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = p_Stack_440;
            local_168._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = local_448;
            local_168._error._msg._M_string_length = local_470;
            local_168._isMirrored = local_480._0_1_;
            local_168._readerInit = bVar25;
            local_168._structuredAppend.id._M_string_length = local_498;
            local_168._structuredAppend.index = auStack_4a8._0_4_;
            local_168._structuredAppend.count = auStack_4a8._4_4_;
            local_168._lineCount = (int)local_4b0;
            local_168._versionNumber = local_4b0._4_4_;
            local_168._ecLevel._M_string_length = local_4c8;
            local_168._content.defaultCharset = local_4d4;
            local_168._content.hasECI = bStack_4d3;
            local_168._content.symbology = local_4d8;
            local_168._content.encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = local_4e0;
            local_168._content.encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_finish = pEStack_4e8;
            local_168._content.encodings.
            super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)local_508.field_2._8_8_;
            local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)local_508.field_2._M_allocated_capacity;
            local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)local_508._M_string_length;
            local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_508._M_dataplus._M_p;
            p_Stack_440 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_448 = (element_type *)0x0;
            local_468._M_local_buf[0] = '\0';
            local_470 = 0;
            local_478 = local_438;
            local_490._M_local_buf[0] = '\0';
            local_498 = 0;
            local_4c0._M_local_buf[0] = '\0';
            local_4c8 = 0;
            local_4e0 = (pointer)0x0;
            pEStack_4e8 = (pointer)0x0;
            local_508.field_2._8_8_ = 0;
            local_508.field_2._M_allocated_capacity = 0;
            local_508._M_string_length = 0;
            local_508._M_dataplus._M_p = (pointer)0x0;
            local_4d0 = &local_4c0;
            local_4a0 = &local_490;
            if (local_300 != &local_2f0) {
              operator_delete(local_300,CONCAT71(uStack_2ef,local_2f0) + 1);
            }
            if (local_328 != &local_318) {
              operator_delete(local_328,CONCAT71(uStack_317,local_318) + 1);
            }
            if (local_378 != &local_368) {
              operator_delete(local_378,CONCAT71(uStack_367,local_368) + 1);
            }
            if (local_568.encodings.
                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_568.encodings.
                              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_568.encodings.
                                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_568.encodings.
                                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_568.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_568.bytes.
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_568.bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_568.bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            local_168._versionNumber = version->versionNumber;
            DecoderResult::DecoderResult(local_570,&local_168);
            if (local_168._extra.super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_168._extra.
                         super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._error._msg._M_dataplus._M_p != paVar24) {
              operator_delete(local_168._error._msg._M_dataplus._M_p,
                              local_168._error._msg.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._structuredAppend.id._M_dataplus._M_p != paVar1) {
              operator_delete(local_168._structuredAppend.id._M_dataplus._M_p,
                              local_168._structuredAppend.id.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._ecLevel._M_dataplus._M_p != &local_168._ecLevel.field_2) {
              operator_delete(local_168._ecLevel._M_dataplus._M_p,
                              local_168._ecLevel.field_2._M_allocated_capacity + 1);
            }
            if (local_168._content.encodings.
                super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_168._content.encodings.
                              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_168._content.encodings.
                                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_168._content.encodings.
                                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            if (local_168._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_168._content.bytes.
                              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_168._content.bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_168._content.bytes.
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            iVar11 = 1;
          }
          if (local_238.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_238.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_238.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_238.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          bVar10 = iVar11 == 2;
        }
        std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::
        ~vector(&local_250);
      } while (bVar10);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      return local_570;
    }
    uVar26 = (long)local_1e0.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage -
             (long)local_1e0.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  }
  operator_delete(local_1e0.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start,uVar26);
  return local_570;
}

Assistant:

static DecoderResult DoDecode(const BitMatrix& bits)
{
	// Construct a parser and read version, error-correction level
	const Version* version = VersionForDimensionsOf(bits);
	if (version == nullptr)
		return FormatError("Invalid matrix dimension");

	// Read codewords
	ByteArray codewords = CodewordsFromBitMatrix(bits, *version);
	if (codewords.empty())
		return FormatError("Invalid number of code words");

	bool fix259 = false; // see https://github.com/zxing-cpp/zxing-cpp/issues/259
retry:
	// Separate into data blocks
	std::vector<DataBlock> dataBlocks = GetDataBlocks(codewords, *version, fix259);
	if (dataBlocks.empty())
		return FormatError("Invalid number of data blocks");

	// Count total number of data bytes
	ByteArray resultBytes(TransformReduce(dataBlocks, 0, [](const auto& db) { return db.numDataCodewords; }));

	// Error-correct and copy data blocks together into a stream of bytes
	const int dataBlocksCount = Size(dataBlocks);
	for (int j = 0; j < dataBlocksCount; j++) {
		auto& [numDataCodewords, codewords] = dataBlocks[j];
		if (!CorrectErrors(codewords, numDataCodewords)) {
			if(version->versionNumber == 24 && !fix259) {
				fix259 = true;
				goto retry;
			}
			return ChecksumError();
		}

		for (int i = 0; i < numDataCodewords; i++) {
			// De-interlace data blocks.
			resultBytes[i * dataBlocksCount + j] = codewords[i];
		}
	}
#ifdef PRINT_DEBUG
	if (fix259)
		printf("-> needed retry with fix259 for 144x144 symbol\n");
#endif

	// Decode the contents of that stream of bytes
	return DecodedBitStreamParser::Decode(std::move(resultBytes), version->isDMRE())
		.setVersionNumber(version->versionNumber);
}